

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::append(QString *this,QLatin1StringView str)

{
  long lVar1;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView in_stack_00000010;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  anon_unknown.dwarf_2b2524::append_helper<QLatin1StringView>(in_RSI,in_stack_00000010);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::append(QLatin1StringView str)
{
    append_helper(*this, str);
    return *this;
}